

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O3

void Fl_Tooltip::current(Fl_Widget *w)

{
  _func_int ***ppp_Var1;
  Fl_Group *pFVar2;
  
  exit_((Fl_Widget *)0x0);
  pFVar2 = (Fl_Group *)w;
  if (w != (Fl_Widget *)0x0) {
    do {
      if (*(char **)((long)&pFVar2->super_Fl_Widget + 0x70) != (char *)0x0) {
        widget_ = w;
        return;
      }
      ppp_Var1 = &(pFVar2->super_Fl_Widget)._vptr_Fl_Widget;
      pFVar2 = (Fl_Group *)ppp_Var1[1];
    } while ((Fl_Group *)ppp_Var1[1] != (Fl_Group *)0x0);
  }
  return;
}

Assistant:

void Fl_Tooltip::current(Fl_Widget* w) {
#ifdef DEBUG
  printf("Fl_Tooltip::current(w=%p)\n", w);
#endif // DEBUG

  exit_(0);
  // find the enclosing group with a tooltip:
  Fl_Widget* tw = w;
  for (;;) {
    if (!tw) return;
    if (tw->tooltip()) break;
    tw = tw->parent();
  }
  // act just like Fl_Tooltip::enter_() except we can remember a zero:
  widget_ = w;
}